

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_seed
              (mbedtls_ctr_drbg_context *ctx,mbedtls_ssl_recv_t *f_entropy,void *p_entropy,
              uchar *custom,size_t len)

{
  size_t local_78;
  size_t nonce_len;
  uchar key [32];
  int ret;
  size_t len_local;
  uchar *custom_local;
  void *p_entropy_local;
  mbedtls_ssl_recv_t *f_entropy_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  memset(&nonce_len,0,0x20);
  ctx->f_entropy = f_entropy;
  ctx->p_entropy = p_entropy;
  if (ctx->entropy_len == 0) {
    ctx->entropy_len = 0x20;
  }
  if (ctx->reseed_counter < 0) {
    local_78 = good_nonce_len(ctx->entropy_len);
  }
  else {
    local_78 = (size_t)ctx->reseed_counter;
  }
  ctx_local._4_4_ = mbedtls_aes_setkey_enc(&ctx->aes_ctx,(uchar *)&nonce_len,0x100);
  if ((ctx_local._4_4_ == 0) &&
     (ctx_local._4_4_ = mbedtls_ctr_drbg_reseed_internal(ctx,custom,len,local_78),
     ctx_local._4_4_ == 0)) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_seed(mbedtls_ctr_drbg_context *ctx,
                          int (*f_entropy)(void *, unsigned char *, size_t),
                          void *p_entropy,
                          const unsigned char *custom,
                          size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    size_t nonce_len;

    memset(key, 0, MBEDTLS_CTR_DRBG_KEYSIZE);

    /* The mutex is initialized iff f_entropy is set. */
#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init(&ctx->mutex);
#endif

    ctx->f_entropy = f_entropy;
    ctx->p_entropy = p_entropy;

    if (ctx->entropy_len == 0) {
        ctx->entropy_len = MBEDTLS_CTR_DRBG_ENTROPY_LEN;
    }
    /* ctx->reseed_counter contains the desired amount of entropy to
     * grab for a nonce (see mbedtls_ctr_drbg_set_nonce_len()).
     * If it's -1, indicating that the entropy nonce length was not set
     * explicitly, use a sufficiently large nonce for security. */
    nonce_len = (ctx->reseed_counter >= 0 ?
                 (size_t) ctx->reseed_counter :
                 good_nonce_len(ctx->entropy_len));

    /* Initialize with an empty key. */
    if ((ret = mbedtls_aes_setkey_enc(&ctx->aes_ctx, key,
                                      MBEDTLS_CTR_DRBG_KEYBITS)) != 0) {
        return ret;
    }

    /* Do the initial seeding. */
    if ((ret = mbedtls_ctr_drbg_reseed_internal(ctx, custom, len,
                                                nonce_len)) != 0) {
        return ret;
    }
    return 0;
}